

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::AltRefFramePresenceTestLarge::PreEncodeFrameHook
          (AltRefFramePresenceTestLarge *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  AltRefFramePresenceTestLarge *in_stack_00000020;
  
  anon_unknown.dwarf_2863ff::AltRefFramePresenceTestLarge::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, 5);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
      encoder->Control(AV1E_SET_MIN_GF_INTERVAL,
                       altref_test_params_.min_gf_interval);
      encoder->Control(AV1E_SET_MAX_GF_INTERVAL,
                       altref_test_params_.max_gf_interval);
    }
  }